

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

ObjectField *
jsonnet::internal::ObjectField::Local
          (ObjectField *__return_storage_ptr__,Fodder *fodder1,Fodder *fodder2,Fodder *fodder_l,
          Fodder *fodder_r,bool method_sugar,Identifier *id,ArgParams *params,bool trailing_comma,
          Fodder *op_fodder,AST *body,Fodder *comma_fodder)

{
  LocationRange local_50;
  
  local_50.file._M_dataplus._M_p = (pointer)&local_50.file.field_2;
  local_50.file._M_string_length = 0;
  local_50.file.field_2._M_local_buf[0] = '\0';
  local_50.begin.line = 0;
  local_50.begin.column = 0;
  local_50.end.line = 0;
  local_50.end.column = 0;
  ObjectField(__return_storage_ptr__,LOCAL,fodder1,fodder2,fodder_l,fodder_r,VISIBLE,false,
              method_sugar,(AST *)0x0,id,&local_50,params,trailing_comma,op_fodder,body,(AST *)0x0,
              comma_fodder);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

static ObjectField Local(const Fodder &fodder1, const Fodder &fodder2, const Fodder &fodder_l,
                             const Fodder &fodder_r, bool method_sugar, const Identifier *id,
                             const ArgParams &params, bool trailing_comma, const Fodder &op_fodder,
                             AST *body, const Fodder &comma_fodder)
    {
        return ObjectField(LOCAL,
                           fodder1,
                           fodder2,
                           fodder_l,
                           fodder_r,
                           VISIBLE,
                           false,
                           method_sugar,
                           nullptr,
                           id,
                           LocationRange(),
                           params,
                           trailing_comma,
                           op_fodder,
                           body,
                           nullptr,
                           comma_fodder);
    }